

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

void TextElementXML(parsercontext *Context,textwriter *Text,tchar_t *Root)

{
  if (Text->Stream != (stream *)0x0) {
    Text->CC = Context->ToUTF8;
    Text->Element = Root;
    Text->Deep = L'\x01';
    Text->SafeFormat = 0;
    Text->HasChild = 0;
    Text->InsideContent = 0;
    TextPrintf(Text,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<%s");
    return;
  }
  __assert_fail("Text->Stream",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x236,"void TextElementXML(parsercontext *, textwriter *, const tchar_t *)");
}

Assistant:

void TextElementXML(parsercontext *Context, textwriter* Text, const tchar_t* Root)
{
    assert(Text->Stream);
    Text->CC = Context->ToUTF8;
    Text->Element = Root;
    Text->Deep = 1;
    Text->HasChild = 0;
    Text->InsideContent = 0;
    Text->SafeFormat = 0;
    TextPrintf(Text,T("<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<%s"),Root);
}